

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O0

void mi_heap_buf_print_count_value(mi_heap_buf_t *hbuf,char *name,mi_stat_count_t *stat)

{
  undefined8 in_RSI;
  undefined8 in_RDI;
  char buf [128];
  char acStack_98 [16];
  char *in_stack_ffffffffffffff78;
  mi_heap_buf_t *in_stack_ffffffffffffff80;
  undefined1 add_comma;
  
  add_comma = (undefined1)((ulong)in_RDI >> 0x38);
  _mi_snprintf(acStack_98,0x80,"  \"%s\": ",in_RSI);
  mi_heap_buf_print(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  mi_heap_buf_print_count
            ((mi_heap_buf_t *)buf._16_8_,(char *)buf._8_8_,(mi_stat_count_t *)buf._0_8_,
             (_Bool)add_comma);
  return;
}

Assistant:

static void mi_heap_buf_print_count_value(mi_heap_buf_t* hbuf, const char* name, mi_stat_count_t* stat) {
  char buf[128];
  _mi_snprintf(buf, 128, "  \"%s\": ", name);
  buf[127] = 0;
  mi_heap_buf_print(hbuf, buf);
  mi_heap_buf_print_count(hbuf, "", stat, true);
}